

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,double ax,double ay,double az)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_38;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  dVar1 = cos(ay);
  dVar2 = cos(az);
  __return_storage_ptr__->v[0][0] = dVar2 * dVar1;
  local_38 = cos(ay);
  local_38 = -local_38;
  dVar1 = sin(az);
  __return_storage_ptr__->v[0][1] = dVar1 * local_38;
  dVar1 = sin(ay);
  __return_storage_ptr__->v[0][2] = -dVar1;
  dVar1 = sin(ax);
  dVar2 = sin(ay);
  dVar3 = cos(az);
  dVar4 = cos(ax);
  dVar5 = sin(az);
  __return_storage_ptr__->v[1][0] = dVar5 * dVar4 - dVar3 * dVar2 * dVar1;
  dVar1 = sin(ax);
  dVar2 = sin(ay);
  dVar3 = sin(az);
  dVar4 = cos(ax);
  dVar5 = cos(az);
  __return_storage_ptr__->v[1][1] = dVar3 * dVar2 * dVar1 + dVar5 * dVar4;
  local_38 = sin(ax);
  local_38 = -local_38;
  dVar1 = cos(ay);
  __return_storage_ptr__->v[1][2] = dVar1 * local_38;
  dVar1 = cos(ax);
  dVar2 = sin(ay);
  dVar3 = cos(az);
  dVar4 = sin(ax);
  dVar5 = sin(az);
  __return_storage_ptr__->v[2][0] = dVar3 * dVar2 * dVar1 + dVar5 * dVar4;
  dVar1 = cos(ax);
  dVar2 = sin(ay);
  dVar3 = sin(az);
  dVar4 = sin(ax);
  dVar5 = cos(az);
  __return_storage_ptr__->v[2][1] = dVar5 * dVar4 - dVar3 * dVar2 * dVar1;
  dVar1 = cos(ax);
  dVar2 = cos(ay);
  __return_storage_ptr__->v[2][2] = dVar2 * dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(double ax, double ay, double az)
{
  Matrix33d ret;

  ret(0, 0)=cos(ay)*cos(az);
  ret(0, 1)=-cos(ay)*sin(az);
  ret(0, 2)=-sin(ay);

  ret(1, 0)=-sin(ax)*sin(ay)*cos(az)+cos(ax)*sin(az);
  ret(1, 1)=sin(ax)*sin(ay)*sin(az)+cos(ax)*cos(az);
  ret(1, 2)=-sin(ax)*cos(ay);

  ret(2, 0)=cos(ax)*sin(ay)*cos(az)+sin(ax)*sin(az);
  ret(2, 1)=-cos(ax)*sin(ay)*sin(az)+sin(ax)*cos(az);
  ret(2, 2)=cos(ax)*cos(ay);

  return ret;
}